

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseError::PromiseError<Data>(PromiseError *this,Data_conflict *value)

{
  int *piVar1;
  
  (this->m_data)._M_exception_object = (void *)0x0;
  piVar1 = (int *)__cxa_allocate_exception(4);
  DAT_00120258 = DAT_00120258 + 1;
  DAT_00120260 = DAT_00120260 + 1;
  *piVar1 = value->m_value;
  __cxa_throw(piVar1,&Data::typeinfo,Logger::~Logger);
}

Assistant:

PromiseError(const T& value)
    {
        try {
            throw value;
        } catch (...) {
            m_data = std::current_exception();
        }
    }